

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void mbedtls_sha256(uchar *input,size_t ilen,uchar *output,int is224)

{
  undefined1 local_90 [8];
  mbedtls_sha256_context ctx;
  int is224_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.buffer._60_4_ = is224;
  unique0x10000091 = output;
  mbedtls_sha256_init((mbedtls_sha256_context *)local_90);
  mbedtls_sha256_starts((mbedtls_sha256_context *)local_90,ctx.buffer._60_4_);
  mbedtls_sha256_update((mbedtls_sha256_context *)local_90,input,ilen);
  mbedtls_sha256_finish((mbedtls_sha256_context *)local_90,stack0xffffffffffffffe0);
  mbedtls_sha256_free((mbedtls_sha256_context *)local_90);
  return;
}

Assistant:

void mbedtls_sha256( const unsigned char *input, size_t ilen,
             unsigned char output[32], int is224 )
{
    mbedtls_sha256_context ctx;

    mbedtls_sha256_init( &ctx );
    mbedtls_sha256_starts( &ctx, is224 );
    mbedtls_sha256_update( &ctx, input, ilen );
    mbedtls_sha256_finish( &ctx, output );
    mbedtls_sha256_free( &ctx );
}